

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileReader.cxx
# Opt level: O3

optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_> *
cmReadGccDepfile(optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                 *__return_storage_ptr__,char *filePath,string *prefix,
                GccDepfilePrependPaths prependPaths)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  pointer pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rule;
  pointer pbVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  enable_if_t<is_constructible_v<decay_t<vector<cmGccStyleDependency,_allocator<cmGccStyleDependency>_>_>,_std::vector<cmGccStyleDependency>_>,_optional<decay_t<vector<cmGccStyleDependency,_allocator<cmGccStyleDependency>_>_>_>_>
  *deps;
  cmGccDepfileLexerHelper helper;
  iterator __end1;
  undefined1 local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  undefined8 local_e0;
  size_type local_d8;
  pointer local_d0;
  undefined8 local_c8;
  cmGccDepfileLexerHelper local_b8;
  pointer local_90;
  string local_88;
  undefined8 local_68;
  undefined8 local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_b8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_b8.HelperState = Rule;
  local_b8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_b8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  bVar4 = cmGccDepfileLexerHelper::readFile(&local_b8,filePath);
  pcVar5 = local_b8.Content.
           super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bVar4) {
    pcVar2 = (pointer)CONCAT44(local_b8.Content.
                               super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                               local_b8.Content.
                               super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                               ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    pcVar3 = (pointer)CONCAT44(local_b8.Content.
                               super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                               local_b8.Content.
                               super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    local_b8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_b8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    local_b8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    local_b8.Content.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    *(pointer *)
     &(__return_storage_ptr__->
      super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
      ._M_payload._M_value.
      super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl =
         pcVar5;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
             ._M_payload._M_value.
             super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl
     + 8) = pcVar2;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
             ._M_payload._M_value.
             super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl
     + 0x10) = pcVar3;
    local_108._16_8_ = (pointer)0x0;
    local_108._0_8_ = (pointer)0x0;
    local_108._8_8_ = (pointer)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
    ._M_engaged = true;
    std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
              ((vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_> *)local_108);
    local_90 = pcVar2;
    if (pcVar5 != pcVar2) {
      do {
        pbVar1 = (pcVar5->rules).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar6 = (pcVar5->rules).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1;
            pbVar6 = pbVar6 + 1) {
          if (((prependPaths == All) && (prefix->_M_string_length != 0)) &&
             (bVar4 = cmsys::SystemTools::FileIsFullPath(pbVar6), !bVar4)) {
            local_108._8_8_ = (prefix->_M_dataplus)._M_p;
            local_108._0_8_ = prefix->_M_string_length;
            local_108._16_8_ = (pointer)0x0;
            local_68 = 0;
            local_60 = 1;
            local_e8 = &local_50;
            local_50._M_dataplus._M_p._0_1_ = 0x2f;
            local_108._24_8_ = 1;
            local_e0 = 0;
            local_d0 = (pbVar6->_M_dataplus)._M_p;
            local_d8 = pbVar6->_M_string_length;
            local_c8 = 0;
            views._M_len = 3;
            views._M_array = (iterator)local_108;
            local_58 = local_e8;
            cmCatViews(&local_88,views);
            std::__cxx11::string::operator=((string *)pbVar6,(string *)&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
          }
          bVar4 = cmsys::SystemTools::FileIsFullPath(pbVar6);
          if (bVar4) {
            cmsys::SystemTools::CollapseFullPath((string *)local_108,pbVar6);
            std::__cxx11::string::operator=((string *)pbVar6,(string *)local_108);
            if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
              operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
            }
          }
          cmSystemTools::ConvertToLongPath(pbVar6);
        }
        pbVar1 = (pcVar5->paths).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar6 = (pcVar5->paths).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1;
            pbVar6 = pbVar6 + 1) {
          if ((prefix->_M_string_length != 0) &&
             (bVar4 = cmsys::SystemTools::FileIsFullPath(pbVar6), !bVar4)) {
            local_108._8_8_ = (prefix->_M_dataplus)._M_p;
            local_108._0_8_ = prefix->_M_string_length;
            local_108._16_8_ = (pointer)0x0;
            local_68 = 0;
            local_60 = 1;
            local_e8 = &local_50;
            local_50._M_dataplus._M_p._0_1_ = 0x2f;
            local_108._24_8_ = 1;
            local_e0 = 0;
            local_d0 = (pbVar6->_M_dataplus)._M_p;
            local_d8 = pbVar6->_M_string_length;
            local_c8 = 0;
            views_00._M_len = 3;
            views_00._M_array = (iterator)local_108;
            local_58 = local_e8;
            cmCatViews(&local_88,views_00);
            std::__cxx11::string::operator=((string *)pbVar6,(string *)&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
          }
          bVar4 = cmsys::SystemTools::FileIsFullPath(pbVar6);
          if (bVar4) {
            cmsys::SystemTools::CollapseFullPath((string *)local_108,pbVar6);
            std::__cxx11::string::operator=((string *)pbVar6,(string *)local_108);
            if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
              operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
            }
          }
          cmSystemTools::ConvertToLongPath(pbVar6);
        }
        pcVar5 = pcVar5 + 1;
      } while (pcVar5 != local_90);
    }
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
    ._M_engaged = false;
  }
  std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
            (&local_b8.Content);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<cmGccDepfileContent> cmReadGccDepfile(
  const char* filePath, const std::string& prefix,
  GccDepfilePrependPaths prependPaths)
{
  cmGccDepfileLexerHelper helper;
  if (!helper.readFile(filePath)) {
    return cm::nullopt;
  }
  auto deps = cm::make_optional(std::move(helper).extractContent());

  for (auto& dep : *deps) {
    for (auto& rule : dep.rules) {
      if (prependPaths == GccDepfilePrependPaths::All && !prefix.empty() &&
          !cmSystemTools::FileIsFullPath(rule)) {
        rule = cmStrCat(prefix, '/', rule);
      }
      if (cmSystemTools::FileIsFullPath(rule)) {
        rule = cmSystemTools::CollapseFullPath(rule);
      }
      cmSystemTools::ConvertToLongPath(rule);
    }
    for (auto& path : dep.paths) {
      if (!prefix.empty() && !cmSystemTools::FileIsFullPath(path)) {
        path = cmStrCat(prefix, '/', path);
      }
      if (cmSystemTools::FileIsFullPath(path)) {
        path = cmSystemTools::CollapseFullPath(path);
      }
      cmSystemTools::ConvertToLongPath(path);
    }
  }

  return deps;
}